

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O2

bool tinyusdz::tydra::VisitPrims
               (Stage *stage,VisitPrimFunction visitor_fun,void *userdata,string *err)

{
  pointer pTVar1;
  string *psVar2;
  bool bVar3;
  long lVar4;
  long extraout_RAX;
  iterator iVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  size_t i;
  ulong uVar6;
  pointer pPVar7;
  pointer root;
  allocator local_1a9;
  string *local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1a0;
  void *local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
  primNameTable;
  token nameTok;
  string local_120;
  Path root_abs_path;
  
  root = (stage->_root_nodes).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
         _M_impl.super__Vector_impl_data._M_start;
  pPVar7 = (stage->_root_nodes).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  lVar4 = ((long)pPVar7 - (long)root) / 0x350;
  local_1a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)visitor_fun;
  local_198 = userdata;
  if ((long)(stage->stage_metas).primChildren.
            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(stage->stage_metas).primChildren.
            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
            super__Vector_impl_data._M_start >> 5 == lVar4) {
    primNameTable._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &primNameTable._M_t._M_impl.super__Rb_tree_header._M_header;
    primNameTable._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    primNameTable._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    primNameTable._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    lVar4 = 0;
    local_1a8 = err;
    primNameTable._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         primNameTable._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (uVar6 = 0;
        args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x350,
        uVar6 < (ulong)(((long)pPVar7 - (long)root) / 0x350); uVar6 = uVar6 + 1) {
      root_abs_path._prim_part._M_dataplus._M_p =
           (pointer)((long)&(root->_abs_path)._prim_part._M_dataplus._M_p + lVar4);
      ::std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>>>
      ::_M_emplace_unique<std::__cxx11::string_const&,tinyusdz::Prim_const*>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>>>
                  *)&primNameTable,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&(root->_elementPath)._prim_part._M_dataplus._M_p + lVar4),
                 (Prim **)&root_abs_path);
      root = (stage->_root_nodes).
             super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
             super__Vector_impl_data._M_start;
      pPVar7 = (stage->_root_nodes).
               super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
               super__Vector_impl_data._M_finish;
      lVar4 = lVar4 + 0x350;
    }
    uVar6 = 0xffffffffffffffff;
    lVar4 = 0;
    do {
      pTVar1 = (stage->stage_metas).primChildren.
               super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar6 = uVar6 + 1;
      if ((ulong)((long)(stage->stage_metas).primChildren.
                        super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)pTVar1 >> 5) <= uVar6) {
        ::std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
        ::~_Rb_tree(&primNameTable._M_t);
        local_1a8 = (string *)0x1;
        goto LAB_00270775;
      }
      ::std::__cxx11::string::string
                ((string *)&nameTok.str_,(string *)((long)&(pTVar1->str_)._M_dataplus._M_p + lVar4))
      ;
      iVar5 = ::std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
              ::find(&primNameTable._M_t,&nameTok.str_);
      psVar2 = local_1a8;
      if ((_Rb_tree_header *)iVar5._M_node == &primNameTable._M_t._M_impl.super__Rb_tree_header) {
        if (local_1a8 != (string *)0x0) {
          ::std::__cxx11::string::string
                    ((string *)&local_190,
                     "Prim name `{}` in root Layer\'s `primChildren` metadatum not found in Layer root."
                     ,(allocator *)&local_120);
          fmt::format<std::__cxx11::string>
                    ((string *)&root_abs_path,(fmt *)&local_190,(string *)&nameTok,args);
          ::std::__cxx11::string::append((string *)psVar2);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
        }
        ::std::__cxx11::string::_M_dispose();
        break;
      }
      lVar4 = lVar4 + 0x20;
      ::std::operator+(&local_190,"/",&nameTok.str_);
      ::std::__cxx11::string::string((string *)&local_120,"",&local_1a9);
      Path::Path(&root_abs_path,&local_190,&local_120);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      args = local_1a0;
      bVar3 = anon_unknown_6::VisitPrimsRec
                        (&root_abs_path,*(Prim **)(iVar5._M_node + 2),0,(VisitPrimFunction)local_1a0
                         ,local_198,local_1a8);
      Path::~Path(&root_abs_path);
      ::std::__cxx11::string::_M_dispose();
    } while (bVar3);
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
    ::~_Rb_tree(&primNameTable._M_t);
    local_1a8 = (string *)0x0;
  }
  else {
    do {
      local_1a8 = (string *)
                  CONCAT44(local_1a8._4_4_,(int)CONCAT71((int7)((ulong)lVar4 >> 8),root == pPVar7));
      if (root == pPVar7) break;
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &primNameTable,"/",&(root->_elementPath)._prim_part);
      ::std::__cxx11::string::string((string *)&nameTok.str_,"",(allocator *)&local_190);
      Path::Path(&root_abs_path,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&primNameTable
                 ,&nameTok.str_);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      bVar3 = anon_unknown_6::VisitPrimsRec
                        (&root_abs_path,root,0,(VisitPrimFunction)local_1a0,local_198,err);
      Path::~Path(&root_abs_path);
      root = root + 1;
      lVar4 = extraout_RAX;
    } while (bVar3);
  }
LAB_00270775:
  return SUB81(local_1a8,0);
}

Assistant:

bool VisitPrims(const tinyusdz::Stage &stage, VisitPrimFunction visitor_fun,
                void *userdata, std::string *err) {
  // if `primChildren` is available, use it
  if (stage.metas().primChildren.size() == stage.root_prims().size()) {
    std::map<std::string, const Prim *> primNameTable;
    for (size_t i = 0; i < stage.root_prims().size(); i++) {
      primNameTable.emplace(stage.root_prims()[i].element_name(),
                            &stage.root_prims()[i]);
    }

    for (size_t i = 0; i < stage.metas().primChildren.size(); i++) {
      value::token nameTok = stage.metas().primChildren[i];
      const auto it = primNameTable.find(nameTok.str());
      if (it != primNameTable.end()) {
        const Path root_abs_path("/" + nameTok.str(), "");
        if (!VisitPrimsRec(root_abs_path, *it->second, 0, visitor_fun, userdata,
                           err)) {
          return false;
        }
      } else {
        if (err) {
          (*err) += fmt::format(
              "Prim name `{}` in root Layer's `primChildren` metadatum not "
              "found in Layer root.",
              nameTok.str());
        }
        return false;
      }
    }

  } else {
    for (const auto &root : stage.root_prims()) {
      const Path root_abs_path("/" + root.element_name(), /* prop part */ "");
      if (!VisitPrimsRec(root_abs_path, root, /* root level */ 0, visitor_fun,
                         userdata, err)) {
        return false;
      }
    }
  }

  return true;
}